

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool cJSON_PrintPreallocated(cJSON *item,char *buffer,int length,cJSON_bool format)

{
  cJSON_bool cVar1;
  long in_FS_OFFSET;
  printbuffer local_50;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.depth = 0;
  cVar1 = 0;
  if (buffer != (char *)0x0 && -1 < length) {
    local_50.length = (size_t)(uint)length;
    local_50.offset = 0;
    local_50.noalloc = 1;
    local_50.hooks.allocate = global_hooks.allocate;
    local_50.hooks.deallocate = global_hooks.deallocate;
    local_50.hooks.reallocate = global_hooks.reallocate;
    local_50.buffer = (uchar *)buffer;
    local_50.format = format;
    cVar1 = print_value(item,&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return cVar1;
  }
  __stack_chk_fail();
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_PrintPreallocated(cJSON *item, char *buffer, const int length, const cJSON_bool format)
{
    printbuffer p = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };

    if ((length < 0) || (buffer == NULL))
    {
        return false;
    }

    p.buffer = (unsigned char*)buffer;
    p.length = (size_t)length;
    p.offset = 0;
    p.noalloc = true;
    p.format = format;
    p.hooks = global_hooks;

    return print_value(item, &p);
}